

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O0

bool __thiscall
ON_CurveProxy::GetNextDiscontinuity
          (ON_CurveProxy *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  uint uVar1;
  double dVar2;
  double s2;
  double thiscrv_t;
  undefined4 local_78;
  continuity cStack_74;
  bool realcrv_rc;
  int realcrv_dtype;
  continuity parametric_c;
  double s1;
  double s0;
  double s;
  double dStack_50;
  bool rc;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  int *dtype_local;
  int *hint_local;
  double *t_local;
  double t1_local;
  double t0_local;
  ON_CurveProxy *pOStack_10;
  continuity c_local;
  ON_CurveProxy *this_local;
  
  s._7_1_ = 0;
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  if (this->m_real_curve != (ON_Curve *)0x0) {
    dStack_50 = curvature_tolerance;
    curvature_tolerance_local = cos_angle_tolerance;
    cos_angle_tolerance_local = (double)dtype;
    dtype_local = hint;
    hint_local = (int *)t;
    t_local = (double *)t1;
    t1_local = t0;
    t0_local._4_4_ = c;
    pOStack_10 = this;
    s1 = RealCurveParameter(this,t0);
    _realcrv_dtype = RealCurveParameter(this,(double)t_local);
    cStack_74 = ON::ParametricContinuity(t0_local._4_4_);
    local_78 = 0;
    uVar1 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                      (s1,_realcrv_dtype,curvature_tolerance_local,dStack_50,this->m_real_curve,
                       (ulong)cStack_74,&s0,dtype_local,&local_78);
    thiscrv_t._7_1_ = (byte)uVar1 & 1;
    if ((uVar1 & 1) != 0) {
      s2 = ThisCurveParameter(this,s0);
      if (((s2 <= t1_local) || ((double)t_local <= s2)) &&
         ((s2 <= (double)t_local || (t1_local <= s2)))) {
        thiscrv_t._7_1_ = 0;
        local_78 = 0;
        dVar2 = _realcrv_dtype * 1.490116119385e-08 + s1 * 0.9999999850988388;
        if (((s1 < dVar2) && (dVar2 < _realcrv_dtype)) || ((_realcrv_dtype < dVar2 && (dVar2 < s1)))
           ) {
          uVar1 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                            (dVar2,_realcrv_dtype,curvature_tolerance_local,dStack_50,
                             this->m_real_curve,(ulong)cStack_74,&s0,dtype_local,&local_78);
          thiscrv_t._7_1_ = (byte)uVar1 & 1;
          if ((uVar1 & 1) != 0) {
            s2 = ThisCurveParameter(this,s0);
          }
        }
      }
      if ((thiscrv_t._7_1_ != 0) &&
         (((t1_local < s2 && (s2 < (double)t_local)) || (((double)t_local < s2 && (s2 < t1_local))))
         )) {
        *(double *)hint_local = s2;
        if (cos_angle_tolerance_local != 0.0) {
          *(undefined4 *)cos_angle_tolerance_local = local_78;
        }
        s._7_1_ = 1;
      }
    }
    if (((s._7_1_ & 1) == 0) && (cStack_74 != t0_local._4_4_)) {
      s._7_1_ = ON_Curve::GetNextDiscontinuity
                          (&this->super_ON_Curve,t0_local._4_4_,t1_local,(double)t_local,
                           (double *)hint_local,dtype_local,(int *)cos_angle_tolerance_local,
                           curvature_tolerance_local,dStack_50);
    }
  }
  return (bool)(s._7_1_ & 1);
}

Assistant:

bool ON_CurveProxy::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  bool rc = false;
  if ( 0 != dtype )
    *dtype = 0;

  if ( 0 != m_real_curve )
  {
    double s;

    // convert to "real" curve parameters
    double s0 = RealCurveParameter( t0 );
    double s1 = RealCurveParameter( t1 );

    // 21 October 2005 Dale Lear:
    //
    // NOTE: If m_bReversed is true, then RealCurveParameter
    //       will reverse the direction of the search.
    //       The commented out code below just messed things up.
    //
    //if ( m_bReversed )
    //{
    //  // NOTE: GetNextDiscontinuity search begins at 
    //  //       "t0" and goes towards "t1" so it is ok if s0 > s1.
    //  s = s0; s0 = s1; s1 = s;
    //}

    ON::continuity parametric_c = ON::ParametricContinuity((int)c);

    int realcrv_dtype = 0;
    bool realcrv_rc = m_real_curve->GetNextDiscontinuity(parametric_c,s0,s1,&s,hint,&realcrv_dtype,cos_angle_tolerance,curvature_tolerance);

    if ( realcrv_rc ) 
    {
      double thiscrv_t = ThisCurveParameter(s);
      if ( !(t0 < thiscrv_t && thiscrv_t < t1) && !(t1 < thiscrv_t && thiscrv_t < t0) )
      {
        realcrv_rc = false;
        realcrv_dtype = 0;
        // Sometimes proxy domain adjustments kill all the precision.
        // To avoid infinite loops, it is critical that *t != t0
        double s2 = ON_SQRT_EPSILON*s1 + (1.0 - ON_SQRT_EPSILON)*s0;
        if ( (s0 < s2 && s2 < s1) || (s1 < s2 && s2 < s0) )
        {
          realcrv_rc = m_real_curve->GetNextDiscontinuity(parametric_c,s2,s1,&s,hint,&realcrv_dtype,cos_angle_tolerance,curvature_tolerance);
          if ( realcrv_rc )
            thiscrv_t = ThisCurveParameter(s);
        }
      }
      if ( realcrv_rc )
      {
        if ( (t0 < thiscrv_t && thiscrv_t < t1) || (t1 < thiscrv_t && thiscrv_t < t0) )
        {
          *t = thiscrv_t;
          if ( dtype )
            *dtype = realcrv_dtype;
          rc = true;
        }
      }
    }

    if ( !rc && parametric_c != c )
    {
      // 20 March 2003 Dale Lear:
      //   Let base class test decide locus continuity questions at ends 
      rc = ON_Curve::GetNextDiscontinuity( c, t0, t1, t, hint, dtype, cos_angle_tolerance, curvature_tolerance );
    }
  }

  return rc;
}